

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::CheckOutput(cmCTestRunTest *this)

{
  cmCTest *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer this_00;
  void *this_01;
  double dVar7;
  string local_3a8 [32];
  ostringstream local_388 [8];
  ostringstream cmCTestLog_msg_1;
  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_210;
  pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_208;
  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_200;
  iterator regIt;
  ostringstream local_1d8 [8];
  ostringstream cmCTestLog_msg;
  int p;
  undefined1 local_48 [8];
  string line;
  double timeEnd;
  double timeout;
  cmCTestRunTest *this_local;
  
  dVar7 = cmsys::SystemTools::GetTime();
  line.field_2._8_8_ = dVar7 + 0.1;
  std::__cxx11::string::string((string *)local_48);
  do {
    uVar2 = line.field_2._8_8_;
    dVar7 = cmsys::SystemTools::GetTime();
    if ((double)uVar2 - dVar7 <= 0.0) {
LAB_0062b5e4:
      this_local._7_1_ = true;
LAB_0062b5ef:
      std::__cxx11::string::~string((string *)local_48);
      return this_local._7_1_;
    }
    iVar4 = cmProcess::GetNextOutputLine(this->TestProcess,(string *)local_48,(double)uVar2 - dVar7)
    ;
    if (iVar4 == 0) {
      this_local._7_1_ = false;
      goto LAB_0062b5ef;
    }
    if (iVar4 != 2) goto LAB_0062b5e4;
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    iVar4 = GetIndex(this);
    poVar5 = (ostream *)std::ostream::operator<<(local_1d8,iVar4);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(poVar5,(string *)local_48);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x3e,pcVar6,false);
    std::__cxx11::string::~string((string *)&regIt);
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
    std::__cxx11::string::operator+=((string *)&this->ProcessOutput,(string *)local_48);
    std::__cxx11::string::operator+=((string *)&this->ProcessOutput,"\n");
    bVar3 = std::
            vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->TestProperties->TimeoutRegularExpressions);
    if (!bVar3) {
      __gnu_cxx::
      __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::__normal_iterator(&local_200);
      local_208 = (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::begin(&this->TestProperties->TimeoutRegularExpressions);
      local_200._M_current = local_208;
      while( true ) {
        local_210._M_current =
             (pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->TestProperties->TimeoutRegularExpressions);
        bVar3 = __gnu_cxx::operator!=(&local_200,&local_210);
        if (!bVar3) break;
        this_00 = __gnu_cxx::
                  __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator->(&local_200);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar3 = cmsys::RegularExpression::find(&this_00->first,pcVar6);
        if (bVar3) {
          std::__cxx11::ostringstream::ostringstream(local_388);
          iVar4 = GetIndex(this);
          poVar5 = (ostream *)std::ostream::operator<<(local_388,iVar4);
          poVar5 = std::operator<<(poVar5,": ");
          poVar5 = std::operator<<(poVar5,"Test timeout changed to ");
          this_01 = (void *)std::ostream::operator<<(poVar5,this->TestProperties->AlternateTimeout);
          std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x4e,pcVar6,false);
          std::__cxx11::string::~string(local_3a8);
          std::__cxx11::ostringstream::~ostringstream(local_388);
          cmProcess::ResetStartTime(this->TestProcess);
          cmProcess::ChangeTimeout(this->TestProcess,this->TestProperties->AlternateTimeout);
          std::
          vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::clear(&this->TestProperties->TimeoutRegularExpressions);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&local_200);
      }
    }
  } while( true );
}

Assistant:

bool cmCTestRunTest::CheckOutput()
{
  // Read lines for up to 0.1 seconds of total time.
  double timeout = 0.1;
  double timeEnd = cmSystemTools::GetTime() + timeout;
  std::string line;
  while ((timeout = timeEnd - cmSystemTools::GetTime(), timeout > 0)) {
    int p = this->TestProcess->GetNextOutputLine(line, timeout);
    if (p == cmsysProcess_Pipe_None) {
      // Process has terminated and all output read.
      return false;
    }
    if (p == cmsysProcess_Pipe_STDOUT) {
      // Store this line of output.
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->GetIndex()
                   << ": " << line << std::endl);
      this->ProcessOutput += line;
      this->ProcessOutput += "\n";

      // Check for TIMEOUT_AFTER_MATCH property.
      if (!this->TestProperties->TimeoutRegularExpressions.empty()) {
        std::vector<
          std::pair<cmsys::RegularExpression, std::string> >::iterator regIt;
        for (regIt = this->TestProperties->TimeoutRegularExpressions.begin();
             regIt != this->TestProperties->TimeoutRegularExpressions.end();
             ++regIt) {
          if (regIt->first.find(this->ProcessOutput.c_str())) {
            cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->GetIndex()
                         << ": "
                         << "Test timeout changed to "
                         << this->TestProperties->AlternateTimeout
                         << std::endl);
            this->TestProcess->ResetStartTime();
            this->TestProcess->ChangeTimeout(
              this->TestProperties->AlternateTimeout);
            this->TestProperties->TimeoutRegularExpressions.clear();
            break;
          }
        }
      }
    } else { // if(p == cmsysProcess_Pipe_Timeout)
      break;
    }
  }
  return true;
}